

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle2.cpp
# Opt level: O0

void __thiscall OpenMD::GofRAngle2::preProcess(GofRAngle2 *this)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  double *pdVar1;
  reference pvVar2;
  double *pdVar3;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  uint j;
  uint i;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb8;
  uint local_10;
  uint local_c;
  
  local_c = 0;
  while( true ) {
    __last._M_current = (double *)(ulong)local_c;
    pdVar1 = (double *)
             std::
             vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ::size((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                     *)(in_RDI._M_current + 0x2c4));
    if (pdVar1 <= __last._M_current) break;
    local_10 = 0;
    while( true ) {
      pdVar1 = (double *)(ulong)local_10;
      pvVar2 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)(in_RDI._M_current + 0x2c4),(ulong)local_c);
      pdVar3 = (double *)
               std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::size(pvVar2);
      if (pdVar3 <= pdVar1) break;
      pvVar2 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)(in_RDI._M_current + 0x2c4),(ulong)local_c);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](pvVar2,(ulong)local_10);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffffb8);
      pvVar2 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             *)(in_RDI._M_current + 0x2c4),(ulong)local_c);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](pvVar2,(ulong)local_10);
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffffb8);
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (in_RDI,__last,pdVar1);
      local_10 = local_10 + 1;
    }
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void GofRAngle2::preProcess() {
    for (unsigned int i = 0; i < avgGofr_.size(); ++i) {
      for (unsigned int j = 0; j < avgGofr_[i].size(); ++j) {
        std::fill(avgGofr_[i][j].begin(), avgGofr_[i][j].end(), 0.0);
      }
    }
  }